

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v9::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  iVar2 = lhs1->exp_;
  iVar10 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + iVar2;
  iVar3 = lhs2->exp_;
  iVar11 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + iVar3;
  iVar7 = iVar11;
  if (iVar11 < iVar10) {
    iVar7 = iVar10;
  }
  uVar14 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = rhs->exp_;
  iVar1 = iVar4 + uVar14;
  if (iVar7 + 1 < iVar1) {
LAB_0011460f:
    iVar8 = -1;
  }
  else if (iVar1 < iVar7) {
LAB_0011461d:
    iVar8 = 1;
  }
  else {
    iVar7 = iVar3;
    if (iVar2 < iVar3) {
      iVar7 = iVar2;
    }
    if (iVar4 <= iVar7) {
      iVar7 = iVar4;
    }
    iVar8 = 0;
    if (iVar7 < iVar1) {
      uVar12 = 0;
      do {
        uVar14 = uVar14 - 1;
        iVar8 = iVar4 + uVar14 + 1;
        if (iVar10 < iVar8 || iVar8 <= iVar2) {
          uVar6 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar2) + uVar14;
          if ((int)uVar5 < 0) goto LAB_00114743;
          uVar6 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar11 < iVar8 || iVar8 <= iVar3) {
          uVar13 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar3) + uVar14;
          if ((int)uVar5 < 0) goto LAB_00114743;
          uVar13 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar1 < iVar8 || iVar8 <= iVar4) {
          uVar9 = 0;
        }
        else {
          if ((int)uVar14 < 0) {
LAB_00114743:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                        ,0x199,"negative value");
          }
          uVar9 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar14];
        }
        uVar9 = uVar9 | uVar12;
        uVar13 = uVar13 + uVar6;
        if (uVar9 < uVar13) goto LAB_0011461d;
        if (1 < uVar9 - uVar13) goto LAB_0011460f;
        uVar12 = uVar9 - uVar13 << 0x20;
      } while (iVar7 < (int)(iVar4 + uVar14));
      iVar8 = -(uint)(uVar9 != uVar13);
    }
  }
  return iVar8;
}

Assistant:

FMT_CONSTEXPR20 int num_bigits() const {
    return static_cast<int>(bigits_.size()) + exp_;
  }